

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.hpp
# Opt level: O0

TimeRepresentation<count_time<9,_long>_>
gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>(string_view timeString)

{
  TimeRepresentation<count_time<9,_long>_> *in_RSI;
  double in_RDI;
  time_units in_stack_0000004c;
  undefined1 in_stack_00000050 [16];
  undefined8 local_8;
  
  getTimeValue((string_view)in_stack_00000050,in_stack_0000004c);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation(in_RSI,in_RDI);
  return (TimeRepresentation<count_time<9,_long>_>)local_8;
}

Assistant:

timeX loadTimeFromString(std::string_view timeString)
{
    return timeX(getTimeValue(timeString));
}